

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (SelectorSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  SourceRange range_00;
  bitmask<slang::ast::ASTFlags> extraFlags;
  optional<int> value;
  bool bVar1;
  ExpressionSyntax *this;
  uint32_t *puVar2;
  byte in_DL;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  uint *in_RSI;
  SyntaxNode *in_RDI;
  SequenceRange SVar4;
  RangeSelectSyntax *rs;
  optional<int> val;
  ASTContext *in_stack_00000088;
  SequenceRange range;
  ASTContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  SourceLocation in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  _Storage<int,_true> in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined8 local_58;
  bitmask<slang::ast::ASTFlags> local_38;
  _Optional_payload_base<int> local_2c;
  byte local_21;
  uint32_t local_c;
  _Storage<unsigned_int,_true> _Stack_8;
  undefined1 local_4;
  ulong uVar3;
  
  local_21 = in_DL & 1;
  if (in_RDI->kind == BitSelect) {
    slang::syntax::SyntaxNode::as<slang::syntax::BitSelectSyntax>(in_RDI);
    this = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xb434bf);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AssertionDelayOrRepetition);
    extraFlags.m_bits._4_4_ = in_stack_ffffffffffffff9c._M_value;
    extraFlags.m_bits._0_4_ = in_stack_ffffffffffffff98;
    local_2c = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         ((ASTContext *)in_stack_ffffffffffffff90,
                          (ExpressionSyntax *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),extraFlags);
    SequenceRange((SequenceRange *)0xb434f8);
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_2c);
    value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
         in_stack_ffffffffffffffa0;
    value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value = in_stack_ffffffffffffff9c._M_value;
    range_00.startLoc._4_4_ = in_stack_ffffffffffffff8c;
    range_00.startLoc._0_4_ = in_stack_ffffffffffffff88;
    range_00.endLoc = in_stack_ffffffffffffff90;
    bVar1 = ASTContext::requirePositive(in_stack_ffffffffffffff80,value,range_00);
    uVar3 = extraout_RDX;
    if (bVar1) {
      puVar2 = (uint32_t *)std::optional<int>::operator*((optional<int> *)0xb4354c);
      local_c = *puVar2;
      std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                ((optional<unsigned_int> *)this,in_RSI);
      _Stack_8._M_value = (uint)local_58;
      local_4 = (undefined1)((ulong)local_58 >> 0x20);
      uVar3 = extraout_RDX_00;
    }
  }
  else {
    slang::syntax::SyntaxNode::as<slang::syntax::RangeSelectSyntax>(in_RDI);
    SVar4 = fromSyntax((RangeSelectSyntax *)
                       range.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>,in_stack_00000088,syntax._7_1_);
    uVar3 = (ulong)SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._4_4_;
    local_4 = SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged;
    local_c = SVar4.min;
    _Stack_8._M_value =
         SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
  }
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_8._M_value;
  SVar4.min = local_c;
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ =
       (undefined4)CONCAT71((int7)(uVar3 >> 8),local_4);
  return SVar4;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const SelectorSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    if (syntax.kind == SyntaxKind::BitSelect) {
        auto val = context.evalInteger(*syntax.as<BitSelectSyntax>().expr,
                                       ASTFlags::AssertionDelayOrRepetition);

        SequenceRange range;
        if (context.requirePositive(val, syntax.sourceRange()))
            range.max = range.min = uint32_t(*val);

        return range;
    }
    else {
        auto& rs = syntax.as<RangeSelectSyntax>();
        return fromSyntax(rs, context, allowUnbounded);
    }
}